

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.hpp
# Opt level: O0

void __thiscall Diligent::AsyncTaskBase::SetStatus(AsyncTaskBase *this,ASYNC_TASK_STATUS TaskStatus)

{
  ASYNC_TASK_STATUS AVar1;
  Char *pCVar2;
  undefined1 local_e8 [8];
  string msg_5;
  string msg_4;
  string msg_3;
  string msg_2;
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  ASYNC_TASK_STATUS TaskStatus_local;
  AsyncTaskBase *this_local;
  
  msg.field_2._12_4_ = TaskStatus;
  AVar1 = std::atomic::operator_cast_to_ASYNC_TASK_STATUS((atomic *)&this->m_TaskStatus);
  if (TaskStatus != AVar1) {
    switch(msg.field_2._12_4_) {
    case 0:
      FormatString<char[27]>((string *)local_38,(char (*) [27])"UNKNOWN is invalid status.");
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"SetStatus",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/ThreadPool.hpp"
                 ,0x6d);
      std::__cxx11::string::~string((string *)local_38);
      break;
    case 1:
      AVar1 = std::atomic::operator_cast_to_ASYNC_TASK_STATUS((atomic *)&this->m_TaskStatus);
      if (AVar1 != ASYNC_TASK_STATUS_RUNNING) {
        FormatString<char[69]>
                  ((string *)((long)&msg_2.field_2 + 8),
                   (char (*) [69])
                   "A task should only be moved to NOT_STARTED state from RUNNING state.");
        pCVar2 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar2,"SetStatus",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/ThreadPool.hpp"
                   ,0x72);
        std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
      }
      break;
    case 2:
      AVar1 = std::atomic::operator_cast_to_ASYNC_TASK_STATUS((atomic *)&this->m_TaskStatus);
      if (AVar1 != ASYNC_TASK_STATUS_NOT_STARTED) {
        FormatString<char[64]>
                  ((string *)((long)&msg_3.field_2 + 8),
                   (char (*) [64])"A task should be moved to RUNNING state from NOT_STARTED state.")
        ;
        pCVar2 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar2,"SetStatus",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/ThreadPool.hpp"
                   ,0x77);
        std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
      }
      break;
    case 3:
      AVar1 = std::atomic::operator_cast_to_ASYNC_TASK_STATUS((atomic *)&this->m_TaskStatus);
      if ((AVar1 != ASYNC_TASK_STATUS_NOT_STARTED) &&
         (AVar1 = std::atomic::operator_cast_to_ASYNC_TASK_STATUS((atomic *)&this->m_TaskStatus),
         AVar1 != ASYNC_TASK_STATUS_RUNNING)) {
        FormatString<char[85]>
                  ((string *)((long)&msg_4.field_2 + 8),
                   (char (*) [85])
                   "A task should be moved to CANCELLED state from either NOT_STARTED or RUNNING states."
                  );
        pCVar2 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar2,"SetStatus",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/ThreadPool.hpp"
                   ,0x7d);
        std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
      }
      break;
    case 4:
      AVar1 = std::atomic::operator_cast_to_ASYNC_TASK_STATUS((atomic *)&this->m_TaskStatus);
      if (AVar1 != ASYNC_TASK_STATUS_RUNNING) {
        FormatString<char[61]>
                  ((string *)((long)&msg_5.field_2 + 8),
                   (char (*) [61])"A task should be moved to COMPLETE state from RUNNING state.");
        pCVar2 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar2,"SetStatus",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/ThreadPool.hpp"
                   ,0x82);
        std::__cxx11::string::~string((string *)(msg_5.field_2._M_local_buf + 8));
      }
      break;
    default:
      FormatString<char[23]>((string *)local_e8,(char (*) [23])"Unexpected task status");
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"SetStatus",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/ThreadPool.hpp"
                 ,0x86);
      std::__cxx11::string::~string((string *)local_e8);
    }
  }
  std::atomic<Diligent::ASYNC_TASK_STATUS>::store
            (&this->m_TaskStatus,msg.field_2._12_4_,memory_order_seq_cst);
  return;
}

Assistant:

SetStatus(ASYNC_TASK_STATUS TaskStatus) override final
    {
#ifdef DILIGENT_DEVELOPMENT
        if (TaskStatus != m_TaskStatus)
        {
            switch (TaskStatus)
            {
                case ASYNC_TASK_STATUS_UNKNOWN:
                    DEV_ERROR("UNKNOWN is invalid status.");
                    break;

                case ASYNC_TASK_STATUS_NOT_STARTED:
                    DEV_CHECK_ERR(m_TaskStatus == ASYNC_TASK_STATUS_RUNNING,
                                  "A task should only be moved to NOT_STARTED state from RUNNING state.");
                    break;

                case ASYNC_TASK_STATUS_RUNNING:
                    DEV_CHECK_ERR(m_TaskStatus == ASYNC_TASK_STATUS_NOT_STARTED,
                                  "A task should be moved to RUNNING state from NOT_STARTED state.");
                    break;

                case ASYNC_TASK_STATUS_CANCELLED:
                    DEV_CHECK_ERR((m_TaskStatus == ASYNC_TASK_STATUS_NOT_STARTED ||
                                   m_TaskStatus == ASYNC_TASK_STATUS_RUNNING),
                                  "A task should be moved to CANCELLED state from either NOT_STARTED or RUNNING states.");
                    break;

                case ASYNC_TASK_STATUS_COMPLETE:
                    DEV_CHECK_ERR(m_TaskStatus == ASYNC_TASK_STATUS_RUNNING,
                                  "A task should be moved to COMPLETE state from RUNNING state.");
                    break;

                default:
                    UNEXPECTED("Unexpected task status");
            }
        }
#endif
        m_TaskStatus.store(TaskStatus);
    }